

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_separate_image_to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  VariableID samp_id;
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  CompilerError *this_00;
  char (*in_stack_fffffffffffffe30) [2];
  string local_1b0;
  string local_190;
  SPIRType sampled_type;
  
  pSVar1 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id);
  if ((((pSVar1 != (SPIRVariable *)0x0) &&
       (pSVar2 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,*(uint32_t *)&(pSVar1->super_IVariant).field_0xc),
       *(int *)&(pSVar2->super_IVariant).field_0xc == 0x10)) && ((pSVar2->image).sampled == 1)) &&
     ((pSVar2->image).dim != DimBuffer)) {
    samp_id.id = (this->super_Compiler).dummy_sampler_id;
    if ((this->options).vulkan_semantics != true) {
      if (samp_id.id != 0) {
        to_combined_image_sampler_abi_cxx11_(__return_storage_ptr__,this,(VariableID)id,samp_id);
        return __return_storage_ptr__;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sampled_type,
                 "Cannot find dummy sampler ID. Was build_dummy_sampler_for_combined_images() called?"
                 ,(allocator *)&stack0xfffffffffffffe30);
      CompilerError::CompilerError(this_00,(string *)&sampled_type);
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (samp_id.id != 0) {
      SPIRType::SPIRType(&sampled_type,pSVar2);
      sampled_type.super_IVariant._12_4_ = 0x11;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&stack0xfffffffffffffe30,this,&sampled_type,0);
      to_expression_abi_cxx11_(&local_190,this,id,true);
      to_expression_abi_cxx11_(&local_1b0,this,(this->super_Compiler).dummy_sampler_id,true);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&stack0xfffffffffffffe30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                 (char (*) [2])&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31b6f8,
                 (char (*) [3])&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
                 in_stack_fffffffffffffe30);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_190);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
      SPIRType::~SPIRType(&sampled_type);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string
              ((string *)&sampled_type,"GL_EXT_samplerless_texture_functions",
               (allocator *)&stack0xfffffffffffffe30);
    require_extension_internal(this,(string *)&sampled_type);
    ::std::__cxx11::string::~string((string *)&sampled_type);
  }
  to_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_separate_image_to_expression(uint32_t id)
{
	auto *var = maybe_get_backing_variable(id);

	// If we are fetching from a plain OpTypeImage, we must combine with a dummy sampler in GLSL.
	// In Vulkan GLSL, we can make use of the newer GL_EXT_samplerless_texture_functions.
	if (var)
	{
		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (options.vulkan_semantics)
			{
				if (dummy_sampler_id)
				{
					// Don't need to consider Shadow state since the dummy sampler is always non-shadow.
					auto sampled_type = type;
					sampled_type.basetype = SPIRType::SampledImage;
					return join(type_to_glsl(sampled_type), "(", to_expression(id), ", ",
					            to_expression(dummy_sampler_id), ")");
				}
				else
				{
					// Newer glslang supports this extension to deal with texture2D as argument to texture functions.
					require_extension_internal("GL_EXT_samplerless_texture_functions");
				}
			}
			else
			{
				if (!dummy_sampler_id)
					SPIRV_CROSS_THROW("Cannot find dummy sampler ID. Was "
					                  "build_dummy_sampler_for_combined_images() called?");

				return to_combined_image_sampler(id, dummy_sampler_id);
			}
		}
	}

	return to_expression(id);
}